

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O2

string * __thiscall
FIX::Message::toString
          (Message *this,string *str,int beginStringField,int bodyLengthField,int checkSumField)

{
  int iVar1;
  FieldBase local_90;
  
  iVar1 = bodyLength(this,beginStringField,bodyLengthField,checkSumField);
  IntField::IntField((IntField *)&local_90,bodyLengthField,iVar1);
  FieldMap::setField(&(this->m_header).super_FieldMap,&local_90,true);
  FieldBase::~FieldBase(&local_90);
  iVar1 = checkSum(this,checkSumField);
  CheckSumField::CheckSumField((CheckSumField *)&local_90,checkSumField,iVar1);
  FieldMap::setField(&(this->m_trailer).super_FieldMap,&local_90,true);
  FieldBase::~FieldBase(&local_90);
  str->_M_string_length = 0;
  *(str->_M_dataplus)._M_p = '\0';
  std::__cxx11::string::reserve((ulong)str);
  FieldMap::calculateString(&(this->m_header).super_FieldMap,str);
  FieldMap::calculateString(&this->super_FieldMap,str);
  FieldMap::calculateString(&(this->m_trailer).super_FieldMap,str);
  return str;
}

Assistant:

std::string& Message::toString( std::string& str, 
                                int beginStringField,
                                int bodyLengthField, 
                                int checkSumField ) const
{
  int length = bodyLength( beginStringField, bodyLengthField, checkSumField );
  m_header.setField( IntField(bodyLengthField, length) );
  m_trailer.setField( CheckSumField(checkSumField, checkSum(checkSumField)) );

#if defined(_MSC_VER) && _MSC_VER < 1300
  str = "";
#else
  str.clear();
#endif

  /*small speculation about the space needed for FIX string*/
  str.reserve( length + 64 );

  m_header.calculateString( str );
  FieldMap::calculateString( str );
  m_trailer.calculateString( str );

  return str;
}